

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void convertMidiFileToSvg(stringstream *output,MidiFile *midifile,Options *options)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  MidiEventList *pMVar7;
  MidiEvent *pMVar8;
  int j;
  char *pcVar9;
  int j_1;
  int iVar10;
  double totalduration;
  int maxpitch;
  int minpitch;
  vector<double,_std::allocator<double>_> trackhues;
  string strokecolor;
  stringstream notes;
  int local_228;
  int local_224;
  double local_220;
  _Vector_base<double,_std::allocator<double>_> local_218;
  string local_200;
  stringstream *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1e0 = output;
  smf::MidiFile::linkNotePairsFIFO(midifile);
  smf::MidiFile::doTimeAnalysis(midifile);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (staffQ != 0) {
    local_220 = StaffThickness;
    totalduration = smf::MidiFile::getFileDurationInSeconds(midifile);
    drawStaves(local_1a8,local_220,&StaffColor_abi_cxx11_,totalduration);
    if (clefQ != 0) {
      drawClefs(local_1a8);
    }
    if (braceQ != 0) {
      drawBrace(local_1a8);
    }
  }
  std::__cxx11::string::string((string *)&local_200,"stroke-color",(allocator *)&local_218);
  smf::Options::getString(&local_1d8,options,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_200,"stroke-width",(allocator *)&local_218);
  local_220 = smf::Options::getDouble(options,&local_200);
  local_220 = local_220 * Scale;
  std::__cxx11::string::~string((string *)&local_200);
  poVar6 = std::operator<<(local_1a8,"\t<g");
  poVar6 = std::operator<<(poVar6," style=\"");
  std::operator<<(poVar6,"stroke-width:");
  poVar6 = std::ostream::_M_insert<double>(local_220);
  poVar6 = std::operator<<(poVar6,";");
  poVar6 = std::operator<<(poVar6," stroke:");
  poVar6 = std::operator<<(poVar6,(string *)&local_1d8);
  poVar6 = std::operator<<(poVar6,";");
  poVar6 = std::operator<<(poVar6,"\"");
  std::operator<<(poVar6,">\n");
  getTrackHues((vector<double,_std::allocator<double>_> *)&local_218,midifile);
  if (lineQ != 0) {
    drawLines(local_1a8,midifile,(vector<double,_std::allocator<double>_> *)&local_218,options);
  }
  local_224 = 0;
  local_228 = 0;
  if (bwQ == 0) {
    uVar3 = smf::MidiFile::size(midifile);
    while (0 < (int)uVar3) {
      uVar3 = uVar3 - 1;
      pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
      iVar4 = hasNotes(pMVar7);
      if (iVar4 != 0) {
        pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
        getMinMaxTrackPitch(pMVar7,&local_224,&local_228);
        poVar6 = std::operator<<(local_1a8,"\t\t<g");
        std::operator<<(poVar6," opacity=\"0.5\"");
        poVar6 = std::operator<<(local_1a8," class=\"note-backdrops ");
        poVar6 = std::operator<<(poVar6,"track-");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
        std::operator<<(poVar6,"\"");
        if (0.0 <= local_218._M_impl.super__Vector_impl_data._M_start[uVar3]) {
          if (bwQ == 0) {
            if (darkQ == 0) {
              poVar6 = std::operator<<(local_1a8," style=\"");
              pcVar9 = "fill:black;";
            }
            else {
              poVar6 = std::operator<<(local_1a8," style=\"");
              pcVar9 = "fill:white;";
            }
          }
          else {
            poVar6 = std::operator<<(local_1a8," style=\"");
            pcVar9 = "fill:none;";
          }
          poVar6 = std::operator<<(poVar6,pcVar9);
          std::operator<<(poVar6,"\"");
        }
        std::operator<<(local_1a8," >\n");
        iVar1 = local_224;
        iVar4 = local_228;
        iVar10 = 0;
        while( true ) {
          pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
          iVar5 = smf::MidiEventList::size(pMVar7);
          if (iVar5 <= iVar10) break;
          pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
          pMVar8 = smf::MidiEventList::operator[](pMVar7,iVar10);
          bVar2 = smf::MidiMessage::isNoteOn(&pMVar8->super_MidiMessage);
          if (bVar2) {
            if ((drumQ == 0.0) && (!NAN(drumQ))) {
              pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
              pMVar8 = smf::MidiEventList::operator[](pMVar7,iVar10);
              iVar5 = smf::MidiMessage::getChannel(&pMVar8->super_MidiMessage);
              if (iVar5 == 9) goto LAB_0011a7dc;
            }
            drawNote(local_1a8,midifile,uVar3,iVar10,0,iVar1,iVar4);
          }
LAB_0011a7dc:
          iVar10 = iVar10 + 1;
        }
        std::operator<<(local_1a8,"\t\t</g>\n");
      }
    }
  }
  uVar3 = smf::MidiFile::size(midifile);
  do {
    do {
      if ((int)uVar3 < 1) {
        std::operator<<(local_1a8,"\t</g>\n");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)(local_1e0 + 0x10),(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_218);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        return;
      }
      uVar3 = uVar3 - 1;
      pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
      iVar4 = hasNotes(pMVar7);
    } while (iVar4 == 0);
    pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
    getMinMaxTrackPitch(pMVar7,&local_224,&local_228);
    poVar6 = std::operator<<(local_1a8,"\t\t<g");
    poVar6 = std::operator<<(poVar6," class=\"track-");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
    std::operator<<(poVar6,"\"");
    if ((transparentQ != 0) && (bwQ == 0)) {
      std::operator<<(local_1a8," filter=\"url(#constantOpacity)\"");
    }
    if (0.0 <= local_218._M_impl.super__Vector_impl_data._M_start[uVar3]) {
      if (bwQ == 0) {
        poVar6 = std::operator<<(local_1a8," style=\"");
        std::operator<<(poVar6,"opacity:");
        poVar6 = std::ostream::_M_insert<double>(Opacity);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6," fill:hsl(");
        poVar6 = std::ostream::_M_insert<double>
                           (local_218._M_impl.super__Vector_impl_data._M_start[uVar3]);
        pcVar9 = ", 100%, 75%);";
      }
      else {
        poVar6 = std::operator<<(local_1a8," style=\"");
        pcVar9 = " fill:white;";
      }
      poVar6 = std::operator<<(poVar6,pcVar9);
      std::operator<<(poVar6,"\"");
    }
    std::operator<<(local_1a8," >\n");
    iVar1 = local_224;
    iVar4 = local_228;
    iVar10 = 0;
    while( true ) {
      pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
      iVar5 = smf::MidiEventList::size(pMVar7);
      if (iVar5 <= iVar10) break;
      pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
      pMVar8 = smf::MidiEventList::operator[](pMVar7,iVar10);
      bVar2 = smf::MidiMessage::isNoteOn(&pMVar8->super_MidiMessage);
      if (bVar2) {
        if ((drumQ == 0.0) && (!NAN(drumQ))) {
          pMVar7 = smf::MidiFile::operator[](midifile,uVar3);
          pMVar8 = smf::MidiEventList::operator[](pMVar7,iVar10);
          iVar5 = smf::MidiMessage::getChannel(&pMVar8->super_MidiMessage);
          if (iVar5 == 9) goto LAB_0011a58f;
        }
        drawNote(local_1a8,midifile,uVar3,iVar10,dataQ,iVar1,iVar4);
      }
LAB_0011a58f:
      iVar10 = iVar10 + 1;
    }
    std::operator<<(local_1a8,"\t\t</g>\n");
  } while( true );
}

Assistant:

void convertMidiFileToSvg(stringstream& output, MidiFile& midifile,
		Options& options) {

	midifile.linkNotePairs();    // first link note-ons to note-offs
	midifile.doTimeAnalysis();   // then create ticks to seconds mapping

	stringstream notes;

	if (staffQ) {
		drawStaves(notes, StaffThickness, StaffColor,
				midifile.getFileDurationInSeconds());
		if (clefQ) {
			drawClefs(notes);
		}
		if (braceQ) {
			drawBrace(notes);
		}
	}

	string strokecolor = options.getString("stroke-color");
	double strokewidth = options.getDouble("stroke-width") * Scale;
	notes << "\t<g"
	      << " style=\""
	      <<   "stroke-width:" << strokewidth << ";"
	      <<   " stroke:" << strokecolor << ";"
	      << "\""
	      << ">\n";

	vector<double> trackhues = getTrackHues(midifile);

	if (lineQ) {
		drawLines(notes, midifile, trackhues, options);
	}

	int minpitch = 0;
	int maxpitch = 0;

	// Draw background for increasing contrast of notes and background
	// (needed due to constant opacity filter):
	int track = 0;
	if (!bwQ) {
		for (int i=midifile.size()-1; i>=0; i--) {
			if (!hasNotes(midifile[i])) {
				continue;
			}
			getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
			track = i;
			notes << "\t\t<g"
					<< " opacity=\"0.5\"";
			notes << " class=\"note-backdrops " << "track-" << i << "\"";
			if (trackhues[i] >= 0.0) {
				if (bwQ) {
					notes << " style=\""
					      << "fill:none;"
					      << "\"";
				 } else if (darkQ) {
					notes << " style=\""
					      << "fill:white;"
					      << "\"";
				 } else {
					notes << " style=\""
					      << "fill:black;"
					      << "\"";
				 }
			}
			notes << " >\n";
			for (int j=0; j<midifile[i].size(); j++) {
				if (!midifile[i][j].isNoteOn()) {
					continue;
				}
				if (!drumQ) {
					if (midifile[i][j].getChannel() == 0x09) {
						continue;
					}
				}
				drawNote(notes, midifile, i, j, 0, minpitch, maxpitch);
			}
			notes << "\t\t</g>\n";
		}
	}

	// draw the actual notes:
	for (int i=midifile.size()-1; i>=0; i--) {
		if (!hasNotes(midifile[i])) {
			continue;
		}
		track = i;
		getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
		notes << "\t\t<g"
		      << " class=\"track-" << track << "\"";
		if (transparentQ && !bwQ) {
			notes << " filter=\"url(#constantOpacity)\"";
		}
		if (trackhues[i] >= 0.0) {
			if (bwQ) {
				notes << " style=\""
				      << " fill:white;"
				      << "\"";
			} else {
				notes << " style=\""
				      << "opacity:" << Opacity << ";"
				      << " fill:hsl(" << trackhues[i] << ", 100%, 75%);"
				      << "\"";
			}
		}
		notes << " >\n";

		for (int j=0; j<midifile[i].size(); j++) {
			if (!midifile[i][j].isNoteOn()) {
				continue;
			}
			if (!drumQ) {
				if (midifile[i][j].getChannel() == 0x09) {
					continue;
				}
			}

			drawNote(notes, midifile, i, j, dataQ, minpitch, maxpitch);
		}
		notes << "\t\t</g>\n";
	}
	notes << "\t</g>\n";

	output << notes.str();
}